

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_use_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  uint *in_RSI;
  long in_RDI;
  int reference_flag;
  int *local_28;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_28 = (int *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_28 = *(int **)(in_RSI + 2);
    *(int **)(in_RSI + 2) = local_28 + 2;
  }
  av1_use_as_reference((int *)(*(long *)(*(long *)(in_RDI + 0xb50) + 0x160) + 0x42d80),*local_28);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_use_reference(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  const int reference_flag = va_arg(args, int);

  av1_use_as_reference(&ctx->ppi->cpi->ext_flags.ref_frame_flags,
                       reference_flag);
  return AOM_CODEC_OK;
}